

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O1

void __thiscall spdlog::details::async_msg::~async_msg(async_msg *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar1;
  
  this_00 = (this->worker_ptr).super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_log_msg_buffer).buffer.super_buffer<char>._vptr_buffer =
       (_func_int **)&PTR_grow_001c8498;
  pcVar1 = (this->super_log_msg_buffer).buffer.super_buffer<char>.ptr_;
  if (pcVar1 != (this->super_log_msg_buffer).buffer.store_) {
    operator_delete(pcVar1,(this->super_log_msg_buffer).buffer.super_buffer<char>.capacity_);
    return;
  }
  return;
}

Assistant:

~async_msg() = default;